

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * shared_container_extract_copy(shared_container_t *sc,uint8_t *typecode)

{
  container_t *local_20;
  container_t *answer;
  uint8_t *typecode_local;
  shared_container_t *sc_local;
  
  if (sc->counter == 0) {
    __assert_fail("sc->counter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d38,
                  "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
  }
  if (sc->typecode != '\x04') {
    sc->counter = sc->counter - 1;
    *typecode = sc->typecode;
    if (sc->counter == 0) {
      local_20 = sc->container;
      sc->container = (container_t *)0x0;
      free(sc);
    }
    else {
      local_20 = container_clone(sc->container,*typecode);
    }
    if (*typecode != '\x04') {
      return local_20;
    }
    __assert_fail("*typecode != SHARED_CONTAINER_TYPE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2d44,
                  "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
  }
  __assert_fail("sc->typecode != SHARED_CONTAINER_TYPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x2d39,
                "container_t *shared_container_extract_copy(shared_container_t *, uint8_t *)");
}

Assistant:

container_t *shared_container_extract_copy(
    shared_container_t *sc, uint8_t *typecode
){
    assert(sc->counter > 0);
    assert(sc->typecode != SHARED_CONTAINER_TYPE);
    sc->counter--;
    *typecode = sc->typecode;
    container_t *answer;
    if (sc->counter == 0) {
        answer = sc->container;
        sc->container = NULL;  // paranoid
        free(sc);
    } else {
        answer = container_clone(sc->container, *typecode);
    }
    assert(*typecode != SHARED_CONTAINER_TYPE);
    return answer;
}